

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O3

Vec_Flt_t * Abc_SclFindWireCaps(SC_WireLoad *pWL,int nFanoutMax)

{
  float fVar1;
  int *piVar2;
  Vec_Flt_t *pVVar3;
  float *__s;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  
  if (pWL == (SC_WireLoad *)0x0) {
    __assert_fail("pWL != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLoad.c"
                  ,0x32,"Vec_Flt_t *Abc_SclFindWireCaps(SC_WireLoad *, int)");
  }
  iVar5 = (pWL->vFanout).nSize;
  uVar14 = (ulong)iVar5;
  if ((long)uVar14 < 1) {
    uVar13 = 0;
  }
  else {
    uVar6 = 0;
    uVar13 = 0;
    do {
      uVar4 = (pWL->vFanout).pArray[uVar6];
      if ((int)uVar13 <= (int)uVar4) {
        uVar13 = uVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar14 != uVar6);
  }
  if ((int)uVar13 < nFanoutMax) {
    uVar13 = nFanoutMax;
  }
  uVar9 = uVar13 + 1;
  pVVar3 = (Vec_Flt_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar13) {
    uVar4 = uVar9;
  }
  pVVar3->nCap = uVar4;
  __s = (float *)malloc((long)(int)uVar4 << 2);
  pVVar3->pArray = __s;
  pVVar3->nSize = uVar9;
  uVar6 = 0;
  memset(__s,0,(long)(int)uVar9 << 2);
  if (iVar5 < 1) {
LAB_003f4587:
    if (0 < (int)uVar13) {
      fVar16 = __s[1];
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        if (uVar13 == 1) {
          uVar4 = 1;
          uVar9 = 2;
        }
        else {
          uVar4 = 1;
          uVar14 = 2;
          fVar15 = fVar16;
          do {
            fVar1 = __s[uVar14];
            if ((fVar1 != 0.0) || (fVar16 = fVar15, uVar8 = uVar4, NAN(fVar1))) {
              uVar10 = uVar4 + 1;
              uVar8 = (uint)uVar14;
              fVar16 = fVar1;
              if ((long)(int)uVar10 < (long)uVar14) {
                lVar11 = (ulong)uVar10 << 0x20;
                lVar12 = 0;
                do {
                  lVar11 = lVar11 + 0x100000000;
                  if ((int)(uVar4 + (int)lVar12) < -1) goto LAB_003f46b3;
                  __s[(ulong)uVar10 + lVar12] =
                       (float)(int)(lVar12 + 1) * ((fVar1 - fVar15) / (float)(int)(uVar8 - uVar4)) +
                       fVar15;
                  lVar12 = lVar12 + 1;
                } while (lVar11 >> 0x20 < (long)uVar14);
              }
            }
            uVar4 = uVar8;
            uVar14 = uVar14 + 1;
            fVar15 = fVar16;
          } while (uVar14 != uVar9);
        }
        if ((int)(uVar4 + 1) < (int)uVar9) {
          fVar15 = pWL->cap;
          fVar1 = pWL->slope;
          iVar5 = 1;
          uVar8 = uVar4;
          do {
            if (((int)uVar4 < -1) || ((int)uVar13 <= (int)uVar8)) {
LAB_003f46b3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                            ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
            }
            uVar8 = uVar8 + 1;
            __s[uVar8] = (float)iVar5 * fVar15 * fVar1 + fVar16;
            iVar5 = iVar5 + 1;
          } while (uVar9 - 1 != uVar8);
        }
      }
      return pVVar3;
    }
  }
  else {
    piVar2 = (pWL->vFanout).pArray;
    uVar4 = (pWL->vLen).nSize;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar6;
    }
    while (uVar7 != uVar6) {
      uVar4 = piVar2[uVar6];
      if (((int)uVar4 < 0) || ((int)uVar13 < (int)uVar4)) goto LAB_003f46b3;
      __s[uVar4] = (pWL->vLen).pArray[uVar6] * pWL->cap;
      uVar6 = uVar6 + 1;
      if (uVar14 == uVar6) goto LAB_003f4587;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns estimated wire capacitances for each fanout count.]

  Description []
               
  SideEffects []`

  SeeAlso     []

***********************************************************************/
Vec_Flt_t * Abc_SclFindWireCaps( SC_WireLoad * pWL, int nFanoutMax )
{
    Vec_Flt_t * vCaps = NULL;
    float EntryPrev, EntryCur, Slope;
    int i, iPrev, k, Entry, EntryMax;
    assert( pWL != NULL );
    // find the biggest fanout count
    EntryMax = 0;
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        EntryMax = Abc_MaxInt( EntryMax, Entry );
    // create the array
    vCaps = Vec_FltStart( Abc_MaxInt(nFanoutMax, EntryMax) + 1 );
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        Vec_FltWriteEntry( vCaps, Entry, Vec_FltEntry(&pWL->vLen, i) * pWL->cap );
    if ( Vec_FltEntry(vCaps, 1) == 0 )
        return vCaps;
    // interpolate between the values
    assert( Vec_FltEntry(vCaps, 1) != 0 );
    iPrev = 1;
    EntryPrev = Vec_FltEntry(vCaps, 1);
    Vec_FltForEachEntryStart( vCaps, EntryCur, i, 2 )
    {
        if ( EntryCur == 0 )
            continue;
        Slope = (EntryCur - EntryPrev) / (i - iPrev);
        for ( k = iPrev + 1; k < i; k++ )
            Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
        EntryPrev = EntryCur;
        iPrev = i;
    }
    // extrapolate after the largest value
    Slope = pWL->cap * pWL->slope;
    for ( k = iPrev + 1; k < i; k++ )
        Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
    // show
//    Vec_FltForEachEntry( vCaps, EntryCur, i )
//        printf( "%3d : %f\n", i, EntryCur );
    return vCaps;
}